

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

void ntru_gen_short(uint16_t *v,uint p,uint w)

{
  uint uVar1;
  int iVar2;
  mp_int *pmVar3;
  mp_int *r;
  uintmax_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong bits;
  
  uVar5 = (ulong)p;
  bits = (ulong)(p * 0x11 + 0x80);
  pmVar3 = mp_random_bits_fn(bits,random_read);
  pmVar3 = mp_resize(pmVar3,bits + 0x20);
  if (p != 0) {
    uVar6 = 0;
    do {
      bits = bits - 1;
      uVar1 = mp_get_bit(pmVar3,bits);
      v[uVar6] = (short)uVar1 + 1;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  mp_reduce_mod_2to(pmVar3,bits);
  r = mp_new(0x40);
  if (p != 0) {
    do {
      mp_mul_integer_into(pmVar3,pmVar3,(uint16_t)uVar5);
      mp_rshift_fixed_into(r,pmVar3,bits);
      mp_reduce_mod_2to(pmVar3,bits);
      uVar4 = mp_get_integer(r);
      iVar2 = (int)uVar4 - w;
      v[uVar5 - 1] = v[uVar5 - 1] & (ushort)(iVar2 >> 0x1f);
      w = (iVar2 >> 0x1f) + w;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  mp_free(r);
  mp_free(pmVar3);
  return;
}

Assistant:

void ntru_gen_short(uint16_t *v, unsigned p, unsigned w)
{
    /*
     * Get enough random data to generate a polynomial all of whose p
     * terms are in {0,+1,-1}, and exactly w of them are nonzero.
     * We'll do this by making up a completely random sequence of
     * {+1,-1} and then setting a random subset of them to 0.
     *
     * So we'll need p random bits to choose the nonzero values, and
     * then (doing it the simplest way) log2(p!) bits to shuffle them,
     * plus say 128 bits to ensure any fluctuations in uniformity are
     * negligible.
     *
     * log2(p!) is a pain to calculate, so we'll bound it above by
     * p*log2(p), which we bound in turn by p*16.
     */
    size_t randbitpos = 17 * p + 128;
    mp_int *randdata = mp_resize(mp_random_bits(randbitpos), randbitpos + 32);

    /*
     * Initial value before zeroing out some terms: p randomly chosen
     * values in {1,2}.
     */
    for (size_t i = 0; i < p; i++)
        v[i] = 1 + mp_get_bit(randdata, --randbitpos);

    /*
     * Hereafter we're going to extract random bits by multiplication,
     * treating randdata as a large fixed-point number.
     */
    mp_reduce_mod_2to(randdata, randbitpos);

    /*
     * Zero out some terms, leaving a randomly selected w of them
     * nonzero.
     */
    uint32_t nonzeros_left = w;
    mp_int *x = mp_new(64);
    for (size_t i = p; i-- > 0 ;) {
        /*
         * Pick a random number out of the number of terms remaning.
         */
        mp_mul_integer_into(randdata, randdata, i+1);
        mp_rshift_fixed_into(x, randdata, randbitpos);
        mp_reduce_mod_2to(randdata, randbitpos);
        size_t j = mp_get_integer(x);

        /*
         * If that's less than nonzeros_left, then we're leaving this
         * number nonzero. Otherwise we're zeroing it out.
         */
        uint32_t keep = (uint32_t)(j - nonzeros_left) >> 31;
        v[i] &= -keep;            /* clear this field if keep == 0 */
        nonzeros_left -= keep;    /* decrement counter if keep == 1 */
    }

    mp_free(x);
    mp_free(randdata);
}